

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

string * __thiscall
flatbuffers::ts::TsGenerator::GenObjApiUnionTypeTS
          (string *__return_storage_ptr__,TsGenerator *this,import_set *imports,StructDef *dependent
          ,IDLOptions *param_3,EnumDef *union_enum)

{
  long lVar1;
  _Base_ptr p_Var2;
  char *__rhs;
  long *plVar3;
  size_t sVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  type_list;
  string type;
  undefined1 local_100 [208];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)local_100);
  type_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &type_list._M_t._M_impl.super__Rb_tree_header._M_header;
  type_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  type_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  type_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar3 = (long *)(param_3->go_namespace)._M_dataplus._M_p;
  type_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       type_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (plVar3 == (long *)(param_3->go_namespace)._M_string_length) {
      sVar4 = 1;
      p_Var2 = type_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)p_Var2 != &type_list._M_t._M_impl.super__Rb_tree_header) {
        __rhs = "|";
        if (sVar4 == type_list._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          __rhs = "";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var2 + 1),__rhs);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)local_100);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        sVar4 = sVar4 + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&type_list._M_t);
      return __return_storage_ptr__;
    }
    lVar1 = *plVar3;
    if (*(long *)(lVar1 + 0xa0) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"",(allocator<char> *)local_100);
      if (*(int *)(lVar1 + 0x38) == 0xf) {
        AddImport<flatbuffers::StructDef>
                  ((ImportDefinition *)local_100,this,imports,&dependent->super_Definition,
                   *(StructDef **)(lVar1 + 0x40));
        std::__cxx11::string::operator=((string *)&type,(string *)(local_100 + 0xa0));
        anon_unknown_10::ImportDefinition::~ImportDefinition((ImportDefinition *)local_100);
      }
      else {
        if (*(int *)(lVar1 + 0x38) != 0xd) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_ts.cpp"
                        ,0x3c4,
                        "std::string flatbuffers::ts::TsGenerator::GenObjApiUnionTypeTS(import_set &, const StructDef &, const IDLOptions &, const EnumDef &)"
                       );
        }
        std::__cxx11::string::assign((char *)&type);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&type_list,&type);
      std::__cxx11::string::~string((string *)&type);
    }
    plVar3 = plVar3 + 1;
  } while( true );
}

Assistant:

std::string GenObjApiUnionTypeTS(import_set &imports,
                                   const StructDef &dependent,
                                   const IDLOptions &,
                                   const EnumDef &union_enum) {
    std::string ret = "";
    std::set<std::string> type_list;

    for (auto it = union_enum.Vals().begin(); it != union_enum.Vals().end();
         ++it) {
      const auto &ev = **it;
      if (ev.IsZero()) { continue; }

      std::string type = "";
      if (IsString(ev.union_type)) {
        type = "string";  // no need to wrap string type in namespace
      } else if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
        type = AddImport(imports, dependent, *ev.union_type.struct_def)
                   .object_name;
      } else {
        FLATBUFFERS_ASSERT(false);
      }
      type_list.insert(type);
    }

    size_t totalPrinted = 0;
    for (auto it = type_list.begin(); it != type_list.end(); ++it) {
      ++totalPrinted;
      ret += *it + ((totalPrinted == type_list.size()) ? "" : "|");
    }

    return ret;
  }